

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoTriangle::Jacobian
          (TPZGeoTriangle *this,TPZFMatrix<double> *coord,TPZVec<double> *param,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  double *pdVar5;
  int i;
  ulong uVar6;
  long row;
  ulong col;
  int j_1;
  long col_00;
  int j;
  ulong row_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_368;
  double local_340;
  TPZFNMatrix<6,_double> dphi;
  TPZFNMatrix<6,_double> VecMatrix;
  TPZFNMatrix<6,_double> axest;
  TPZFNMatrix<3,_double> phi;
  
  uVar4 = (uint)(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  (*(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacobian,2,2);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (axes,2,3);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacinv,2,2);
  TPZFNMatrix<3,_double>::TPZFNMatrix(&phi,3,1);
  TPZFNMatrix<6,_double>::TPZFNMatrix(&dphi,2,3);
  TPZFNMatrix<6,_double>::TPZFNMatrix(&axest,3,2);
  (*(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            ();
  pztopology::TPZTriangle::TShape<double>
            (param,&phi.super_TPZFMatrix<double>,&dphi.super_TPZFMatrix<double>);
  local_340 = 0.0;
  TPZFNMatrix<6,_double>::TPZFNMatrix(&VecMatrix,3,2,&local_340);
  col = 0;
  uVar6 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar6 = col;
  }
  for (; col != 3; col = col + 1) {
    for (row_00 = 0; uVar6 != row_00; row_00 = row_00 + 1) {
      (*(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(coord,row_00,col);
      pdVar5 = TPZFMatrix<double>::operator()(&dphi.super_TPZFMatrix<double>,0,col);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(&VecMatrix.super_TPZFMatrix<double>,row_00,0);
      *pdVar5 = extraout_XMM0_Qa * dVar1 + *pdVar5;
      (*(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(coord,row_00,col);
      pdVar5 = TPZFMatrix<double>::operator()(&dphi.super_TPZFMatrix<double>,1,col);
      dVar1 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()(&VecMatrix.super_TPZFMatrix<double>,row_00,1);
      *pdVar5 = extraout_XMM0_Qa_00 * dVar1 + *pdVar5;
    }
  }
  TPZFMatrix<double>::GramSchmidt
            (&VecMatrix.super_TPZFMatrix<double>,&axest.super_TPZFMatrix<double>,jacobian);
  TPZFMatrix<double>::Transpose(&axest.super_TPZFMatrix<double>,&axes->super_TPZMatrix<double>);
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar1 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar2 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar3 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,0,1);
  *detjac = dVar1 * dVar2 - dVar3 * *pdVar5;
  local_368 = 0.0;
  for (row = 0; row != 2; row = row + 1) {
    for (col_00 = 0; col_00 != 2; col_00 = col_00 + 1) {
      pdVar5 = TPZFMatrix<double>::operator()(jacobian,row,col_00);
      if (local_368 <= ABS(*pdVar5)) {
        local_368 = ABS(*pdVar5);
      }
    }
  }
  if ((ABS(local_368) < 1e-12) || (ABS(*detjac / (local_368 * local_368)) < 1e-12)) {
    *detjac = 1e-12;
  }
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,1,1);
  dVar1 = *pdVar5;
  dVar2 = *detjac;
  pdVar5 = TPZFMatrix<double>::operator()(jacinv,0,0);
  *pdVar5 = dVar1 / dVar2;
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,0,0);
  dVar1 = *pdVar5;
  dVar2 = *detjac;
  pdVar5 = TPZFMatrix<double>::operator()(jacinv,1,1);
  *pdVar5 = dVar1 / dVar2;
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,0,1);
  dVar1 = *pdVar5;
  dVar2 = *detjac;
  pdVar5 = TPZFMatrix<double>::operator()(jacinv,0,1);
  *pdVar5 = -dVar1 / dVar2;
  pdVar5 = TPZFMatrix<double>::operator()(jacobian,1,0);
  dVar1 = *pdVar5;
  dVar2 = *detjac;
  pdVar5 = TPZFMatrix<double>::operator()(jacinv,1,0);
  *pdVar5 = -dVar1 / dVar2;
  TPZFNMatrix<6,_double>::~TPZFNMatrix(&VecMatrix);
  TPZFNMatrix<6,_double>::~TPZFNMatrix(&axest);
  TPZFNMatrix<6,_double>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<3,_double>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

void TPZGeoTriangle::Jacobian(const TPZFMatrix<REAL> & coord, TPZVec<REAL> &param,TPZFMatrix<REAL> &jacobian,TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv){
		
        int spacedim = coord.Rows();
        jacobian.Resize(2,2); axes.Resize(2,3); jacinv.Resize(2,2);
		TPZFNMatrix<3> phi(3,1);
        TPZFNMatrix<6> dphi(2,3),axest(3,2);
		jacobian.Zero();
		Shape(param,phi,dphi);
        TPZFNMatrix<6> VecMatrix(3,2,0.);
        for(int i = 0; i < 3; i++) {
			for(int j = 0; j < spacedim; j++) {
				VecMatrix(j,0) += coord.GetVal(j,i)*dphi(0,i);
				VecMatrix(j,1) += coord.GetVal(j,i)*dphi(1,i);
			}
        }
        VecMatrix.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
		detjac = jacobian(0,0)*jacobian(1,1)-jacobian(1,0)*jacobian(0,1);
    REAL maxjac = 0.;
    for (int i=0; i<2; i++) {
      for (int j=0; j<2; j++) {
        maxjac = Max(maxjac,fabs(jacobian(i,j)));
      }
    }
        if(IsZero(maxjac) || IsZero(detjac/(maxjac*maxjac)))
		{
#ifdef PZDEBUG
			std::stringstream sout;
			sout << "Singular Jacobian " << detjac;
			LOGPZ_ERROR(logger, sout.str())
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) =  jacobian(1,1)/detjac;
        jacinv(1,1) =  jacobian(0,0)/detjac;
        jacinv(0,1) = -jacobian(0,1)/detjac;
        jacinv(1,0) = -jacobian(1,0)/detjac;
	}